

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str-util.cc
# Opt level: O0

uint32_t tinyusdz::detail::to_codepoint(char *s,uint32_t *char_len)

{
  byte bVar1;
  uint32_t uVar2;
  uchar s3;
  uchar s2_1;
  uchar s1_2;
  uchar s0_3;
  uchar s2;
  uchar s1_1;
  uchar s0_2;
  uchar s1;
  uchar s0_1;
  uchar s0;
  uint32_t code;
  uint32_t *char_len_local;
  char *s_local;
  
  if (s == (char *)0x0) {
    *char_len = 0;
    s_local._4_4_ = 0xffffffff;
  }
  else {
    uVar2 = utf8_len(*s);
    *char_len = uVar2;
    if (*char_len == 0) {
      s_local._4_4_ = 0xffffffff;
    }
    else {
      if (*char_len == 1) {
        if (0x7f < (byte)*s) {
          return 0xffffffff;
        }
        _s1_2 = (byte)*s & 0x7f;
      }
      else if (*char_len == 2) {
        if (((*s & 0xe0U) != 0xc0) || ((s[1] & 0xc0U) != 0x80)) {
          return 0xffffffff;
        }
        _s1_2 = ((byte)*s & 0x1f) << 6 | (byte)s[1] & 0x3f;
      }
      else if (*char_len == 3) {
        if ((((*s & 0xf0U) != 0xe0) || ((s[1] & 0xc0U) != 0x80)) || ((s[2] & 0xc0U) != 0x80)) {
          return 0xffffffff;
        }
        _s1_2 = ((byte)*s & 0xf) << 0xc | ((byte)s[1] & 0x3f) << 6 | (byte)s[2] & 0x3f;
      }
      else {
        if (*char_len != 4) {
          *char_len = 0;
          return 0xffffffff;
        }
        bVar1 = s[2];
        if (((((*s & 0xf8U) != 0xf0) || ((s[1] & 0xc0U) != 0x80)) || ((bVar1 & 0xc0) != 0x80)) ||
           ((bVar1 & 0xc0) != 0x80)) {
          return 0xffffffff;
        }
        _s1_2 = ((byte)*s & 7) << 0x12 | ((byte)s[1] & 0x3f) << 0xc | (bVar1 & 0x3f) << 6 |
                (byte)s[3] & 0x3f;
      }
      s_local._4_4_ = _s1_2;
    }
  }
  return s_local._4_4_;
}

Assistant:

inline uint32_t to_codepoint(const char *s, uint32_t &char_len) {
  if (!s) {
    char_len = 0;
    return ~0u;
  }

  char_len = detail::utf8_len(static_cast<unsigned char>(s[0]));
  if (char_len == 0) {
    return ~0u;
  }

  uint32_t code = 0;
  if (char_len == 1) {
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    if (s0 > 0x7f) {
      return ~0u;
    }
    code = uint32_t(s0) & 0x7f;
  } else if (char_len == 2) {
    // 11bit: 110y-yyyx 10xx-xxxx
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    unsigned char s1 = static_cast<unsigned char>(s[1]);

    if (((s0 & 0xe0) == 0xc0) && ((s1 & 0xc0) == 0x80)) {
      code = (uint32_t(s0 & 0x1f) << 6) | (s1 & 0x3f);
    } else {
      return ~0u;
    }
  } else if (char_len == 3) {
    // 16bit: 1110-yyyy 10yx-xxxx 10xx-xxxx
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    unsigned char s1 = static_cast<unsigned char>(s[1]);
    unsigned char s2 = static_cast<unsigned char>(s[2]);
    if (((s0 & 0xf0) == 0xe0) && ((s1 & 0xc0) == 0x80) &&
        ((s2 & 0xc0) == 0x80)) {
      code =
          (uint32_t(s0 & 0xf) << 12) | (uint32_t(s1 & 0x3f) << 6) | (s2 & 0x3f);
    } else {
      return ~0u;
    }
  } else if (char_len == 4) {
    // 21bit: 1111-0yyy 10yy-xxxx 10xx-xxxx 10xx-xxxx
    unsigned char s0 = static_cast<unsigned char>(s[0]);
    unsigned char s1 = static_cast<unsigned char>(s[1]);
    unsigned char s2 = static_cast<unsigned char>(s[2]);
    unsigned char s3 = static_cast<unsigned char>(s[3]);
    if (((s0 & 0xf8) == 0xf0) && ((s1 & 0xc0) == 0x80) &&
        ((s2 & 0xc0) == 0x80) && ((s2 & 0xc0) == 0x80)) {
      code = (uint32_t(s0 & 0x7) << 18) | (uint32_t(s1 & 0x3f) << 12) |
             (uint32_t(s2 & 0x3f) << 6) | uint32_t(s3 & 0x3f);
    } else {
      return ~0u;
    }
  } else {
    // ???
    char_len = 0;
    return ~0u;
  }

  return code;
}